

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void __thiscall Date::Date(Date *this,uint32_t year,Month month,uint32_t day)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined8 extraout_RAX;
  string sStack_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this->days = 0;
  bVar1 = is_date(year,month,day);
  if (bVar1) {
    lVar2 = days_untill_year(year);
    lVar3 = days_untill_month(month,year);
    this->days = this->days + (ulong)day + lVar2 + lVar3 + -1;
    return;
  }
  std::__cxx11::to_string(&local_48,year);
  std::operator+(&local_108,"Error in Date::Date() - (",&local_48);
  std::operator+(&local_e8,&local_108,",");
  std::__cxx11::to_string(&local_128,month);
  std::operator+(&local_c8,&local_e8,&local_128);
  std::operator+(&local_a8,&local_c8,",");
  std::__cxx11::to_string(&sStack_148,day);
  std::operator+(&local_88,&local_a8,&sStack_148);
  std::operator+(&local_68,&local_88,") is not a valid date.");
  error(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&sStack_148);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_48);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Date::Date(uint32_t year, Month month, uint32_t day) : days{0}
{
	if (!is_date(year, month, day))
	{
		error("Error in Date::Date() - (" + std::to_string(year)
			+ ","
			+ std::to_string(int(month)) 
			+ ","
			+ std::to_string(day)
			+ ") is not a valid date."
		);
	}
	days += days_untill_year(year) + days_untill_month(month, year) + day - 1;
}